

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_encoder_factory.cc
# Opt level: O3

PredictionSchemeMethod draco::GetPredictionMethodFromOptions(int att_id,EncoderOptions *options)

{
  PredictionSchemeMethod PVar1;
  PredictionSchemeMethod PVar2;
  int local_44;
  string local_40;
  
  local_44 = att_id;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"prediction_scheme","");
  PVar1 = DracoOptions<int>::GetAttributeInt
                    (&options->super_DracoOptions<int>,&local_44,&local_40,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  PVar2 = PREDICTION_NONE;
  if ((uint)PVar1 < 7) {
    PVar2 = PVar1;
  }
  if (PVar1 == PREDICTION_UNDEFINED) {
    PVar2 = PVar1;
  }
  return PVar2;
}

Assistant:

PredictionSchemeMethod GetPredictionMethodFromOptions(
    int att_id, const EncoderOptions &options) {
  const int pred_type =
      options.GetAttributeInt(att_id, "prediction_scheme", -1);
  if (pred_type == -1) {
    return PREDICTION_UNDEFINED;
  }
  if (pred_type < 0 || pred_type >= NUM_PREDICTION_SCHEMES) {
    return PREDICTION_NONE;
  }
  return static_cast<PredictionSchemeMethod>(pred_type);
}